

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_benchmark.cc
# Opt level: O2

void re2::SearchCachedPCRE(int iters,char *regexp,StringPiece *text,Anchor anchor,bool expect_match)

{
  bool bVar1;
  int iVar2;
  PCRE re;
  LogMessageFatal local_1b0;
  
  PCRE::PCRE(&re,regexp,EnabledCompileOptions);
  bVar1 = std::operator==(re.error_,"");
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
               ,0x400);
    std::operator<<((ostream *)&local_1b0.super_LogMessage.str_,
                    "Check failed: (re.error()) == (\"\")");
    LogMessageFatal::~LogMessageFatal(&local_1b0);
  }
  iVar2 = 0;
  if (0 < iters) {
    iVar2 = iters;
  }
LAB_00125eee:
  do {
    bVar1 = iVar2 == 0;
    iVar2 = iVar2 + -1;
    if (bVar1) {
      PCRE::~PCRE(&re);
      return;
    }
    if (anchor != kAnchored) goto LAB_00125f67;
    bVar1 = PCRE::FullMatchFunctor::operator()
                      ((FullMatchFunctor *)&PCRE::FullMatch,text,&re,(Arg *)PCRE::no_more_args,
                       (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args
                       ,(Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
                       (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args
                       ,(Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
                       (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args
                       ,(Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args);
  } while (bVar1 == expect_match);
  LogMessageFatal::LogMessageFatal
            (&local_1b0,
             "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
             ,0x403);
  std::operator<<((ostream *)&local_1b0.super_LogMessage.str_,
                  "Check failed: (PCRE::FullMatch(text, re)) == (expect_match)");
  goto LAB_00125fd3;
LAB_00125f67:
  bVar1 = PCRE::PartialMatchFunctor::operator()
                    ((PartialMatchFunctor *)&PCRE::PartialMatch,text,&re,(Arg *)PCRE::no_more_args,
                     (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
                     (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
                     (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
                     (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
                     (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args);
  if (bVar1 != expect_match) {
    LogMessageFatal::LogMessageFatal
              (&local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
               ,0x405);
    std::operator<<((ostream *)&local_1b0.super_LogMessage.str_,
                    "Check failed: (PCRE::PartialMatch(text, re)) == (expect_match)");
LAB_00125fd3:
    LogMessageFatal::~LogMessageFatal(&local_1b0);
  }
  goto LAB_00125eee;
}

Assistant:

void SearchCachedPCRE(int iters, const char* regexp, const StringPiece& text,
                     Prog::Anchor anchor, bool expect_match) {
  PCRE re(regexp, PCRE::UTF8);
  CHECK_EQ(re.error(), "");
  for (int i = 0; i < iters; i++) {
    if (anchor == Prog::kAnchored)
      CHECK_EQ(PCRE::FullMatch(text, re), expect_match);
    else
      CHECK_EQ(PCRE::PartialMatch(text, re), expect_match);
  }
}